

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

QModelIndex * __thiscall QVariant::toModelIndex(QModelIndex *__return_storage_ptr__,QVariant *this)

{
  qvariant_cast<QModelIndex>(__return_storage_ptr__,this);
  return __return_storage_ptr__;
}

Assistant:

QModelIndex QVariant::toModelIndex() const
{
    return qvariant_cast<QModelIndex>(*this);
}